

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutLutBalanceEval(If_Man_t *p,If_Cut_t *pCut)

{
  If_DsdMan_t *pIVar1;
  int iVar2;
  int LutSize_00;
  int iVar3;
  uint uVar4;
  If_Obj_t *pIVar5;
  If_Cut_t *pIVar6;
  char *pcVar7;
  uint local_84;
  int local_80;
  uint uLeafMask;
  int nLeafMax;
  int DelayMax;
  int pTimes [15];
  int local_30;
  int i;
  int LutSize;
  char *pCutPerm;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffdfff | 0x2000;
  *(uint *)&pCut->field_0x1c =
       *(uint *)&pCut->field_0x1c & 0xfffff000 | (uint)(1 < *(uint *)&pCut->field_0x1c >> 0x18);
  pCut->uMaskFunc = 0;
  if (*(uint *)&pCut->field_0x1c >> 0x18 == 0) {
    iVar2 = If_CutTruthLit(pCut);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 != 0) {
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0x178,"int If_CutLutBalanceEval(If_Man_t *, If_Cut_t *)");
    }
    p_local._4_4_ = 0;
  }
  else if (*(uint *)&pCut->field_0x1c >> 0x18 == 1) {
    iVar2 = If_CutTruthLit(pCut);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 != 1) {
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0x17d,"int If_CutLutBalanceEval(If_Man_t *, If_Cut_t *)");
    }
    pIVar5 = If_CutLeaf(p,pCut,0);
    pIVar6 = If_ObjCutBest(pIVar5);
    p_local._4_4_ = (int)pIVar6->Delay;
  }
  else {
    pcVar7 = If_CutDsdPerm(p,pCut);
    iVar2 = (int)*p->pPars->pLutStruct;
    LutSize_00 = iVar2 + -0x30;
    uLeafMask = 0xffffffff;
    local_80 = 0;
    local_84 = 0;
    for (local_30 = 0; iVar3 = If_CutLeaveNum(pCut), local_30 < iVar3; local_30 = local_30 + 1) {
      iVar3 = Abc_Lit2Var((int)pcVar7[local_30]);
      pIVar5 = If_CutLeaf(p,pCut,iVar3);
      pIVar6 = If_ObjCutBest(pIVar5);
      (&nLeafMax)[local_30] = (int)pIVar6->Delay;
      if ((int)uLeafMask < (&nLeafMax)[local_30]) {
        uLeafMask = (&nLeafMax)[local_30];
        local_80 = 1;
        local_84 = 1 << ((byte)(local_30 << 1) & 0x1f);
      }
      else if (uLeafMask == (&nLeafMax)[local_30]) {
        local_80 = local_80 + 1;
        local_84 = 1 << ((byte)(local_30 << 1) & 0x1f) | local_84;
      }
    }
    iVar3 = If_CutLeaveNum(pCut);
    if (LutSize_00 < iVar3) {
      *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | 2;
      if (local_80 <= iVar2 + -0x31) {
        pIVar1 = p->pIfDsdMan;
        iVar2 = If_CutDsdLit(p,pCut);
        uVar4 = If_DsdManCheckXY(pIVar1,iVar2,LutSize_00,1,local_84,0,0);
        pCut->uMaskFunc = uVar4;
        if (0 < pCut->uMaskFunc) {
          return uLeafMask + 1;
        }
      }
      pIVar1 = p->pIfDsdMan;
      iVar2 = If_CutDsdLit(p,pCut);
      uVar4 = If_DsdManCheckXY(pIVar1,iVar2,LutSize_00,1,0,0,0);
      pCut->uMaskFunc = uVar4;
      if (pCut->uMaskFunc == 0) {
        p_local._4_4_ = -1;
      }
      else {
        p_local._4_4_ = uLeafMask + 2;
      }
    }
    else {
      p_local._4_4_ = uLeafMask + 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutLutBalanceEval( If_Man_t * p, If_Cut_t * pCut )
{
    pCut->fUser = 1;
    pCut->Cost = pCut->nLeaves > 1 ? 1 : 0;
    pCut->uMaskFunc = 0;
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 0 );
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 1 );
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        char * pCutPerm = If_CutDsdPerm( p, pCut );
        int LutSize = p->pPars->pLutStruct[0] - '0';
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        int DelayMax = -1, nLeafMax = 0;
        unsigned uLeafMask = 0;
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, Abc_Lit2Var((int)pCutPerm[i])))->Delay; 
            if ( DelayMax < pTimes[i] )
                DelayMax = pTimes[i], nLeafMax = 1, uLeafMask = (1 << (i << 1));
            else if ( DelayMax == pTimes[i] )
                nLeafMax++, uLeafMask |= (1 << (i << 1));
        }
        if ( If_CutLeaveNum(pCut) <= LutSize )
            return DelayMax + 1;
        pCut->Cost = 2;
        if ( nLeafMax <= LutSize - 1 )
        {
            pCut->uMaskFunc = If_DsdManCheckXY( p->pIfDsdMan, If_CutDsdLit(p, pCut), LutSize, 1, uLeafMask, 0, 0 );
            if ( pCut->uMaskFunc > 0 )
                return DelayMax + 1;
        }
        pCut->uMaskFunc = If_DsdManCheckXY( p->pIfDsdMan, If_CutDsdLit(p, pCut), LutSize, 1, 0, 0, 0 );
        if ( pCut->uMaskFunc == 0 )
            return -1;
        return DelayMax + 2;
    }
}